

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib556.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  ssize_t sVar4;
  bool bVar5;
  ulong local_440;
  size_t total;
  char buf [1024];
  size_t iolen;
  char *request;
  CURL *curl;
  CURLcode res;
  char *URL_local;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      curl._4_4_ = curl_easy_setopt(lVar2,0x2712,URL);
      if ((((curl._4_4_ == 0) && (curl._4_4_ = curl_easy_setopt(lVar2,0x8d,1), curl._4_4_ == 0)) &&
          (curl._4_4_ = curl_easy_setopt(lVar2,0x29,1), curl._4_4_ == 0)) &&
         (curl._4_4_ = curl_easy_perform(lVar2), curl._4_4_ == 0)) {
        sVar3 = strlen("GET /556 HTTP/1.2\r\nHost: ninja\r\n\r\n");
        curl._4_4_ = curl_easy_send(lVar2,"GET /556 HTTP/1.2\r\nHost: ninja\r\n\r\n",sVar3,
                                    buf + 0x3f8);
        if (curl._4_4_ == 0) {
          local_440 = 0;
          do {
            curl._4_4_ = curl_easy_recv(lVar2,&total,0x400,buf + 0x3f8);
            if ((buf._1016_8_ != 0) && (sVar4 = write(1,&total,buf._1016_8_), sVar4 == 0)) break;
            local_440 = buf._1016_8_ + local_440;
            if ((curl._4_4_ == 0) || (bVar5 = false, curl._4_4_ == 0x51)) {
              bVar5 = local_440 < 0x81;
            }
          } while (bVar5);
        }
      }
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      URL_local._4_4_ = curl._4_4_;
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  if((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_CONNECT_ONLY, 1L);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  res = curl_easy_perform(curl);

  if(!res) {
    /* we are connected, now get a HTTP document the raw way */
    const char *request =
#ifdef CURL_DOES_CONVERSIONS
      /* ASCII representation with escape sequences for non-ASCII platforms */
      "\x47\x45\x54\x20\x2f\x35\x35\x36\x20\x48\x54\x54\x50\x2f\x31\x2e"
      "\x32\x0d\x0a\x48\x6f\x73\x74\x3a\x20\x6e\x69\x6e\x6a\x61\x0d\x0a"
      "\x0d\x0a";
#else
      "GET /556 HTTP/1.2\r\n"
      "Host: ninja\r\n\r\n";
#endif
    size_t iolen;
    char buf[1024];

    res = curl_easy_send(curl, request, strlen(request), &iolen);

    if(!res) {
      /* we assume that sending always work */
      size_t total=0;

      do {
        /* busy-read like crazy */
        res = curl_easy_recv(curl, buf, 1024, &iolen);

#ifdef TPF
        sleep(1); /* avoid ctl-10 dump */
#endif

        if(iolen) {
          /* send received stuff to stdout */
          if(!write(STDOUT_FILENO, buf, iolen))
            break;
        }
        total += iolen;

      } while(((res == CURLE_OK) || (res == CURLE_AGAIN)) && (total < 129));
    }
  }

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}